

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetBooleanVerifier::verifyFloat
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference)

{
  ostringstream *this_00;
  bool bVar1;
  char *pcVar2;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  undefined1 local_1a0 [384];
  
  state.m_preguard = 0xde;
  state.m_value = 0xde;
  state.m_postguard = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&state,testCtx);
  if ((bVar1) && ((bool)state.m_value != (reference != 0.0))) {
    local_1a0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// ERROR: expected ");
    pcVar2 = "mapped_ == GL_FALSE";
    if (reference != 0.0) {
      pcVar2 = "mapped_ == GL_TRUE";
    }
    if (NAN(reference)) {
      pcVar2 = "mapped_ == GL_TRUE";
    }
    std::operator<<((ostream *)this_00,pcVar2 + 0xb);
    std::operator<<((ostream *)this_00,"; got ");
    pcVar2 = "non-boolean";
    if (state.m_value == '\0') {
      pcVar2 = "GL_FALSE";
    }
    if (state.m_value == '\x01') {
      pcVar2 = "GL_TRUE";
    }
    std::operator<<((ostream *)this_00,pcVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyFloat (tcu::TestContext& testCtx, GLenum name, GLfloat reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLboolean expectedGLState = reference != 0.0f ? GL_TRUE : GL_FALSE;

	if (state != expectedGLState)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << (expectedGLState==GL_TRUE ? "GL_TRUE" : "GL_FALSE") << "; got " << (state == GL_TRUE ? "GL_TRUE" : (state == GL_FALSE ? "GL_FALSE" : "non-boolean")) << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}